

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextWindow(char *str_id,int mouse_button,bool also_over_items)

{
  bool bVar1;
  ImGuiID id_00;
  ImGuiID id;
  bool also_over_items_local;
  char *pcStack_10;
  int mouse_button_local;
  char *str_id_local;
  
  pcStack_10 = str_id;
  if (str_id == (char *)0x0) {
    pcStack_10 = "window_context";
  }
  id_00 = ImGuiWindow::GetID(GImGui->CurrentWindow,pcStack_10,(char *)0x0);
  bVar1 = IsMouseReleased(mouse_button);
  if (((bVar1) && (bVar1 = IsWindowHovered(8), bVar1)) &&
     ((also_over_items || (bVar1 = IsAnyItemHovered(), !bVar1)))) {
    OpenPopupEx(id_00);
  }
  bVar1 = BeginPopupEx(id_00,0x141);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextWindow(const char* str_id, int mouse_button, bool also_over_items)
{
    if (!str_id)
        str_id = "window_context";
    ImGuiID id = GImGui->CurrentWindow->GetID(str_id);
    if (IsMouseReleased(mouse_button) && IsWindowHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        if (also_over_items || !IsAnyItemHovered())
            OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}